

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cms_stop_project.cc
# Opt level: O1

int __thiscall
aliyun::Cms::StopProject
          (Cms *this,CmsStopProjectRequestType *req,CmsStopProjectResponseType *response,
          CmsErrorInfo *error_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator *piVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  AliRpcRequest *this_00;
  long *plVar7;
  size_t sVar8;
  Value *pVVar9;
  size_type *psVar10;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  string local_328;
  allocator<char> local_301;
  Value local_300;
  CmsStopProjectResponseType *local_2e8;
  long *local_2e0;
  long local_2d8;
  long local_2d0 [2];
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar6 = "https";
  }
  local_2e0 = local_2d0;
  local_2e8 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,pcVar6,pcVar6 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_300);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,this->secret_,&local_301);
  piVar2 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar2->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_2e0,local_2d8 + (long)local_2e0);
  std::__cxx11::string::append((char *)&local_140);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2a0.field_2._M_allocated_capacity = *psVar10;
    local_2a0.field_2._8_8_ = plVar7[3];
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *psVar10;
    local_2a0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2a0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar2) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar8 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar6,pcVar6 + sVar8);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_300,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"StopProject","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->project_name)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"ProjectName","");
    pcVar3 = (req->project_name)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar3,pcVar3 + (req->project_name)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)&local_328);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  iVar5 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar5 == 0) {
    iVar5 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_2c0);
    if ((0 < iVar5) && (local_2c0._M_string_length != 0)) {
      bVar4 = Json::Reader::parse(&local_140,&local_2c0,&local_300,true);
      if (bVar4) {
        if (error_info != (CmsErrorInfo *)0x0 && iVar5 != 200) {
          bVar4 = Json::Value::isMember(&local_300,"RequestId");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_300,"RequestId");
            Json::Value::asString_abi_cxx11_(&local_328,pVVar9);
          }
          else {
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_328,anon_var_dwarf_29baa1 + 9);
          }
          std::__cxx11::string::operator=((string *)error_info,(string *)&local_328);
          paVar1 = &local_328.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != paVar1) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Json::Value::isMember(&local_300,"Code");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_300,"Code");
            Json::Value::asString_abi_cxx11_(&local_328,pVVar9);
          }
          else {
            local_328._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_328,anon_var_dwarf_29baa1 + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_328);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != paVar1) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Json::Value::isMember(&local_300,"HostId");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_300,"HostId");
            Json::Value::asString_abi_cxx11_(&local_328,pVVar9);
          }
          else {
            local_328._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_328,anon_var_dwarf_29baa1 + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_328);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != paVar1) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
          bVar4 = Json::Value::isMember(&local_300,"Message");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_300,"Message");
            Json::Value::asString_abi_cxx11_(&local_328,pVVar9);
          }
          else {
            local_328._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_328,anon_var_dwarf_29baa1 + 9);
          }
          std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_328);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != paVar1) {
            operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_2e8 != (CmsStopProjectResponseType *)0x0 && iVar5 == 200) {
          bVar4 = Json::Value::isMember(&local_300,"Code");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_300,"Code");
            Json::Value::asString_abi_cxx11_(&local_328,pVVar9);
            std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_328);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_300,"Message");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_300,"Message");
            Json::Value::asString_abi_cxx11_(&local_328,pVVar9);
            std::__cxx11::string::operator=((string *)&local_2e8->message,(string *)&local_328);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_300,"Success");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_300,"Success");
            Json::Value::asString_abi_cxx11_(&local_328,pVVar9);
            std::__cxx11::string::operator=((string *)&local_2e8->success,(string *)&local_328);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1
                             );
            }
          }
          bVar4 = Json::Value::isMember(&local_300,"TraceId");
          if (bVar4) {
            pVVar9 = Json::Value::operator[](&local_300,"TraceId");
            Json::Value::asString_abi_cxx11_(&local_328,pVVar9);
            std::__cxx11::string::operator=((string *)&local_2e8->trace_id,(string *)&local_328);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        goto LAB_0014efe2;
      }
    }
    if (error_info == (CmsErrorInfo *)0x0) goto LAB_0014efdd;
    pcVar6 = "parse response failed";
  }
  else {
    if (error_info == (CmsErrorInfo *)0x0) {
LAB_0014efdd:
      iVar5 = -1;
      goto LAB_0014efe2;
    }
    pcVar6 = "connect to host failed";
  }
  iVar5 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar6);
LAB_0014efe2:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_300);
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0,local_2d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                             local_2c0.field_2._M_local_buf[0]) + 1);
  }
  return iVar5;
}

Assistant:

int Cms::StopProject(const CmsStopProjectRequestType& req,
                      CmsStopProjectResponseType* response,
                       CmsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","StopProject");
  if(!req.project_name.empty()) {
    req_rpc->AddRequestQuery("ProjectName", req.project_name);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}